

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int aead_decrypt(st_ptls_traffic_protection_t *ctx,void *output,size_t *outlen,void *input,
                size_t inlen)

{
  size_t sVar1;
  uint8_t local_3d [5];
  size_t sStack_38;
  uint8_t aad [5];
  size_t inlen_local;
  void *input_local;
  size_t *outlen_local;
  void *output_local;
  st_ptls_traffic_protection_t *ctx_local;
  
  sStack_38 = inlen;
  build_aad(local_3d,inlen);
  sVar1 = ptls_aead_decrypt(ctx->aead,output,input,sStack_38,ctx->seq,local_3d,5);
  *outlen = sVar1;
  if (sVar1 == 0xffffffffffffffff) {
    ctx_local._4_4_ = 0x14;
  }
  else {
    ctx->seq = ctx->seq + 1;
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int aead_decrypt(struct st_ptls_traffic_protection_t *ctx, void *output, size_t *outlen, const void *input, size_t inlen)
{
    uint8_t aad[5];

    build_aad(aad, inlen);
    if ((*outlen = ptls_aead_decrypt(ctx->aead, output, input, inlen, ctx->seq, aad, sizeof(aad))) == SIZE_MAX)
        return PTLS_ALERT_BAD_RECORD_MAC;
    ++ctx->seq;
    return 0;
}